

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O3

enable_if_t<std::is_same<PathData,_PathData>::value,_void> __thiscall
rlottie::internal::model::Property<rlottie::internal::model::PathData,_void>::
value<rlottie::internal::model::PathData>
          (Property<rlottie::internal::model::PathData,_void> *this,int frameNo,VPath *path)

{
  pointer pVVar1;
  VPointF VVar2;
  float *pfVar3;
  VPointF VVar4;
  VPath *in_RCX;
  float fVar5;
  float fVar6;
  
  if (this->isValue_ == false) {
    pVVar1 = (this->impl_).value_.mPoints.super__Vector_base<VPointF,_std::allocator<VPointF>_>.
             _M_impl.super__Vector_impl_data._M_start;
    fVar6 = (float)frameNo;
    VVar4 = *pVVar1;
    if (fVar6 <= *(float *)VVar4) {
      this = (Property<rlottie::internal::model::PathData,_void> *)((long)VVar4 + 0x10);
    }
    else {
      VVar2 = pVVar1[1];
      if (fVar6 < *(float *)((long)VVar2 + 0xffffffffffffffb4)) {
        if (VVar4 != VVar2) {
          pfVar3 = (float *)((long)VVar4 + 0x20);
          do {
            fVar5 = pfVar3[-8];
            if ((fVar5 <= fVar6) && (fVar6 < pfVar3[-7])) {
              if (*(VInterpolator **)(pfVar3 + -6) == (VInterpolator *)0x0) {
                fVar5 = 0.0;
              }
              else {
                fVar5 = VInterpolator::value
                                  (*(VInterpolator **)(pfVar3 + -6),
                                   (fVar6 - fVar5) / (pfVar3[-7] - fVar5));
              }
              PathData::lerp((PathData *)(pfVar3 + -4),(PathData *)(pfVar3 + 4),(PathData *)path,
                             fVar5,in_RCX);
            }
            VVar4 = (VPointF)(pfVar3 + 0xc);
            pfVar3 = pfVar3 + 0x14;
          } while (VVar4 != VVar2);
        }
        return;
      }
      this = (Property<rlottie::internal::model::PathData,_void> *)
             ((long)VVar2 + 0xffffffffffffffe0);
    }
  }
  PathData::toPath((PathData *)this,path);
  return;
}

Assistant:

auto value(int frameNo, VPath &path) const ->
        typename std::enable_if_t<std::is_same<T, forT>::value, void>
    {
        if (isStatic()) {
            value().toPath(path);
        } else {
            const auto &vec = animation().frames_;
            if (vec.front().start_ >= frameNo)
                return vec.front().value_.start_.toPath(path);
            if (vec.back().end_ <= frameNo)
                return vec.back().value_.end_.toPath(path);

            for (const auto &keyFrame : vec) {
                if (frameNo >= keyFrame.start_ && frameNo < keyFrame.end_) {
                    T::lerp(keyFrame.value_.start_, keyFrame.value_.end_,
                            keyFrame.progress(frameNo), path);
                }
            }
        }
    }